

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall
QMdiAreaPrivate::_q_deactivateAllWindows(QMdiAreaPrivate *this,QMdiSubWindow *aboutToActivate)

{
  QWidget *this_00;
  Data *pDVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  Data *pDVar6;
  QWidget *pQVar7;
  long lVar8;
  QWidget *this_01;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->ignoreWindowStateChange != false) goto LAB_0043f065;
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (aboutToActivate == (QMdiSubWindow *)0x0) {
    QObject::sender();
    aboutToActivate =
         (QMdiSubWindow *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if ((QObject *)aboutToActivate != (QObject *)0x0) goto LAB_0043eec8;
    pDVar6 = (Data *)0x0;
  }
  else {
LAB_0043eec8:
    pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)aboutToActivate);
  }
  pDVar1 = (this->aboutToBecomeActive).wp.d;
  (this->aboutToBecomeActive).wp.d = pDVar6;
  (this->aboutToBecomeActive).wp.value = (QObject *)aboutToActivate;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  local_50.d = (this->childWindows).d.d;
  pQVar2 = (this->childWindows).d.ptr;
  local_50.size = (this->childWindows).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.ptr = pQVar2;
  if (local_50.size != 0) {
    lVar8 = local_50.size * 0x10;
    lVar9 = 0;
    do {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar9);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = *(QWidget **)((long)&(pQVar2->wp).value + lVar9);
      }
      bVar4 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::deactivateAllWindows");
      if (bVar4) {
        pDVar6 = (this->aboutToBecomeActive).wp.d;
        if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)(this->aboutToBecomeActive).wp.value;
        }
        if (pQVar7 != this_01) {
          this->ignoreWindowStateChange = true;
          bVar5 = this->showActiveWindowMaximized;
          if ((((this->options).super_QFlagsStorageHelper<QMdiArea::AreaOption,_4>.
                super_QFlagsStorage<QMdiArea::AreaOption>.i & 1) == 0) && ((bVar5 & 1) == 0)) {
            bVar4 = QWidget::isMaximized(this_01);
            if (bVar4) {
              bVar5 = (byte)(this_01->data->widget_attributes >> 0xf) & 1;
            }
            else {
              bVar5 = false;
            }
            this->showActiveWindowMaximized = (bool)bVar5;
          }
          if ((bVar5 & 1) != 0) {
            bVar4 = QWidget::isMaximized(this_01);
            if (bVar4) {
              if ((this_00->data->widget_attributes & 0x400) == 0) {
                this->updatesDisabledByUs = true;
                QWidget::setUpdatesEnabled(this_00,false);
              }
              QWidget::showNormal(this_01);
            }
          }
          bVar4 = QWidget::isMinimized(this_01);
          if (bVar4) {
            bVar4 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_01);
            if ((!bVar4) &&
               (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 0x40000) == 0)) {
              QWidget::lower(this_01);
            }
          }
          this->ignoreWindowStateChange = false;
          QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)&this_01->field_0x8,false,true);
        }
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar8 != lVar9);
  }
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
LAB_0043f065:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::_q_deactivateAllWindows(QMdiSubWindow *aboutToActivate)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    if (!aboutToActivate)
        aboutToBecomeActive = qobject_cast<QMdiSubWindow *>(q->sender());
    else
        aboutToBecomeActive = aboutToActivate;
    Q_ASSERT(aboutToBecomeActive);

    // Take a copy because child->showNormal() could indirectly call
    // QCoreApplication::sendEvent(), which could call unknown code that e.g.
    // recurses into the class modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::deactivateAllWindows") || aboutToBecomeActive == child)
            continue;
        // We don't want to handle signals caused by child->showNormal().
        ignoreWindowStateChange = true;
        if (!(options & QMdiArea::DontMaximizeSubWindowOnActivation) && !showActiveWindowMaximized)
            showActiveWindowMaximized = child->isMaximized() && child->isVisible();
        if (showActiveWindowMaximized && child->isMaximized()) {
            if (q->updatesEnabled()) {
                updatesDisabledByUs = true;
                q->setUpdatesEnabled(false);
            }
            child->showNormal();
        }
        if (child->isMinimized() && !child->isShaded() && !windowStaysOnTop(child))
            child->lower();
        ignoreWindowStateChange = false;
        child->d_func()->setActive(false);
    }
}